

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

void ExtensionObject_deleteMembers(UA_ExtensionObject *p,UA_DataType *_)

{
  int iVar1;
  void *p_00;
  
  if (p->encoding < UA_EXTENSIONOBJECT_DECODED) {
    iVar1 = *(int *)((long)&p->content + 4);
    if ((iVar1 == 5) || (iVar1 == 3)) {
      free((void *)(*(ulong *)((long)&p->content + 0x10) & 0xfffffffffffffffe));
    }
    p_00 = (void *)((ulong)(p->content).encoded.body.data & 0xfffffffffffffffe);
  }
  else {
    if ((p->encoding != UA_EXTENSIONOBJECT_DECODED) ||
       (p_00 = (p->content).decoded.data, p_00 == (void *)0x0)) {
      return;
    }
    deleteMembers_noInit(p_00,(p->content).decoded.type);
  }
  free(p_00);
  return;
}

Assistant:

static void
ExtensionObject_deleteMembers(UA_ExtensionObject *p, const UA_DataType *_) {
    switch(p->encoding) {
    case UA_EXTENSIONOBJECT_ENCODED_NOBODY:
    case UA_EXTENSIONOBJECT_ENCODED_BYTESTRING:
    case UA_EXTENSIONOBJECT_ENCODED_XML:
        NodeId_deleteMembers(&p->content.encoded.typeId, NULL);
        String_deleteMembers(&p->content.encoded.body, NULL);
        break;
    case UA_EXTENSIONOBJECT_DECODED:
        if(p->content.decoded.data)
            UA_delete(p->content.decoded.data, p->content.decoded.type);
        break;
    default:
        break;
    }
}